

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gia.h
# Opt level: O2

int Gia_ObjLevelId(Gia_Man_t *p,int Id)

{
  Vec_Int_t *p_00;
  int iVar1;
  
  p_00 = p->vLevels;
  Vec_IntFillExtra(p_00,Id + 1,0);
  iVar1 = Vec_IntEntry(p_00,Id);
  return iVar1;
}

Assistant:

static inline int          Gia_ObjLevelId( Gia_Man_t * p, int Id )             { return Vec_IntGetEntry(p->vLevels, Id);                    }